

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ExpressionResultBuilder::ExpressionResultBuilder
          (ExpressionResultBuilder *this,OfType resultType)

{
  OfType in_ESI;
  ExprComponents *in_RDI;
  ExprComponents *this_00;
  
  this_00 = in_RDI;
  AssertionResultData::AssertionResultData((AssertionResultData *)in_RDI);
  ExprComponents::ExprComponents(this_00);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&in_RDI[1].op);
  *(OfType *)&in_RDI->field_0x40 = in_ESI;
  return;
}

Assistant:

ExpressionResultBuilder::ExpressionResultBuilder( ResultWas::OfType resultType ) {
        m_data.resultType = resultType;
    }